

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

void __thiscall QScrollerPrivate::setContentPositionHelperScrolling(QScrollerPrivate *this)

{
  undefined1 auVar1 [16];
  QPointF QVar2;
  double dVar3;
  qreal qVar4;
  double dVar5;
  int *piVar6;
  QDebug QVar7;
  undefined8 this_00;
  qint64 now;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined8 uStack_114;
  undefined4 local_10c;
  char *local_108;
  QDebug local_100;
  QPointF local_f8;
  QPointF local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [8];
  undefined1 local_a8 [24];
  QDebug local_90 [3];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  char *pcStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  now = QElapsedTimer::elapsed();
  dVar3 = (this->overshootPosition).xp + (this->contentPosition).xp;
  dVar5 = (this->overshootPosition).yp + (this->contentPosition).yp;
  local_a8._8_4_ = SUB84(dVar5,0);
  local_a8._0_8_ = dVar3;
  local_a8._12_4_ = (int)((ulong)dVar5 >> 0x20);
  qVar4 = nextSegmentPosition(&this->xSegments,now,dVar3);
  local_a8._0_8_ = qVar4;
  qVar4 = nextSegmentPosition(&this->ySegments,now,(qreal)local_a8._8_8_);
  local_a8._8_8_ = qVar4;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78 = 2;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    pcStack_60 = lcScroller::category.name;
    QMessageLogger::debug();
    this_00 = local_d8._0_8_;
    QVar9.m_data = (storage_type *)0x3f;
    QVar9.m_size = (qsizetype)&local_120;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)this_00,(QString *)&local_120);
    piVar6 = (int *)CONCAT44(uStack_11c,local_120);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_11c,local_120),2,0x10);
      }
    }
    if (*(QTextStream *)(local_d8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_d8._0_8_,' ');
    }
    local_c0._0_8_ = local_d8._0_8_;
    *(int *)(local_d8._0_8_ + 0x28) = *(int *)(local_d8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)local_90,(QPointF *)local_c0);
    QVar7.stream = local_90[0].stream;
    QVar10.m_data = &DAT_0000000a;
    QVar10.m_size = (qsizetype)&local_120;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_120);
    piVar6 = (int *)CONCAT44(uStack_11c,local_120);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_11c,local_120),2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_90[0].stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_90[0].stream,' ');
    }
    local_c0._8_8_ = local_90[0].stream;
    *(int *)(local_90[0].stream + 0x28) = *(int *)(local_90[0].stream + 0x28) + 1;
    ::operator<<((Stream *)local_b0,(QPointF *)(local_c0 + 8));
    QDebug::~QDebug((QDebug *)local_b0);
    QDebug::~QDebug((QDebug *)(local_c0 + 8));
    QDebug::~QDebug(local_90);
    QDebug::~QDebug((QDebug *)local_c0);
    QDebug::~QDebug((QDebug *)local_d8);
  }
  auVar1._0_8_ = (this->contentPosRange).xp;
  auVar1._8_8_ = (this->contentPosRange).yp;
  auVar8._0_8_ = (this->contentPosRange).w + (double)auVar1._0_8_;
  auVar8._8_8_ = (this->contentPosRange).h + (double)auVar1._8_8_;
  auVar8 = minpd(auVar8,local_a8._0_16_);
  local_d8 = maxpd(auVar8,auVar1);
  dVar3 = local_a8._8_8_ - local_d8._8_8_;
  QVar2.yp._0_4_ = SUB84(dVar3,0);
  QVar2.xp = local_a8._0_8_ - local_d8._0_8_;
  QVar2.yp._4_4_ = (int)((ulong)dVar3 >> 0x20);
  this->overshootPosition = QVar2;
  (this->contentPosition).xp = local_d8._0_8_;
  (this->contentPosition).yp = local_d8._8_8_;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  uStack_68 = 0xffffffff;
  uStack_64 = 0xffffffff;
  pcStack_60 = (char *)0xffffffffffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QScrollEvent::QScrollEvent
            ((QScrollEvent *)&local_78,&this->contentPosition,&this->overshootPosition,
             this->firstScroll ^ ScrollUpdated);
  qt_sendSpontaneousEvent(this->target,(QEvent *)&local_78);
  this->firstScroll = false;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_120 = 2;
    uStack_11c = 0;
    uStack_118 = 0;
    uStack_114 = 0;
    local_10c = 0;
    local_108 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar7.stream = local_100.stream;
    QVar11.m_data = (storage_type *)0x13;
    QVar11.m_size = (qsizetype)local_90;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)local_90);
    if ((QArrayData *)local_90[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_90[0].stream = *(int *)local_90[0].stream + -1;
      UNLOCK();
      if (*(int *)local_90[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_90[0].stream,2,0x10);
      }
    }
    if (*(QTextStream *)(local_100.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_100.stream,' ');
    }
    local_f8.xp = (qreal)local_100.stream;
    *(int *)(local_100.stream + 0x28) = *(int *)(local_100.stream + 0x28) + 1;
    ::operator<<((QDebug)&local_f8.yp,&local_f8);
    qVar4 = local_f8.yp;
    QVar12.m_data = (storage_type *)0x10;
    QVar12.m_size = (qsizetype)local_90;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<((QTextStream *)qVar4,(QString *)local_90);
    if ((QArrayData *)local_90[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_90[0].stream = *(int *)local_90[0].stream + -1;
      UNLOCK();
      if (*(int *)local_90[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_90[0].stream,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_f8.yp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.yp,' ');
    }
    local_e8.xp = local_f8.yp;
    *(int *)((long)local_f8.yp + 0x28) = *(int *)((long)local_f8.yp + 0x28) + 1;
    ::operator<<((QDebug)&local_e8.yp,&local_e8);
    QDebug::~QDebug((QDebug *)&local_e8.yp);
    QDebug::~QDebug((QDebug *)&local_e8);
    QDebug::~QDebug((QDebug *)&local_f8.yp);
    QDebug::~QDebug((QDebug *)&local_f8);
    QDebug::~QDebug(&local_100);
  }
  QScrollEvent::~QScrollEvent((QScrollEvent *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::setContentPositionHelperScrolling()
{
    qint64 now = monotonicTimer.elapsed();
    QPointF newPos = contentPosition + overshootPosition;

    newPos.setX(nextSegmentPosition(xSegments, now, newPos.x()));
    newPos.setY(nextSegmentPosition(ySegments, now, newPos.y()));

    // -- set the position and handle overshoot
    qCDebug(lcScroller) << "QScroller::setContentPositionHelperScrolling()\n"
                        "  --> overshoot:" << overshootPosition << "- new pos:" << newPos;

    QPointF newClampedPos = clampToRect(newPos, contentPosRange);

    overshootPosition = newPos - newClampedPos;
    contentPosition = newClampedPos;

    QScrollEvent se(contentPosition, overshootPosition, firstScroll ? QScrollEvent::ScrollStarted
                                                                    : QScrollEvent::ScrollUpdated);
    sendEvent(target, &se);
    firstScroll = false;

    qCDebug(lcScroller) << "  --> new position:" << newClampedPos << "- new overshoot:" << overshootPosition;
}